

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

Texture3DView __thiscall
glu::TextureTestUtil::getSubView
          (TextureTestUtil *this,Texture3DView *view,int baseLevel,int maxLevel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Texture3DView TVar4;
  Texture3DView local_18;
  
  iVar2 = (int)this + -1;
  iVar1 = iVar2;
  if (baseLevel < iVar2) {
    iVar1 = baseLevel;
  }
  iVar3 = 0;
  if (-1 < baseLevel) {
    iVar3 = iVar1;
  }
  if (maxLevel < iVar2) {
    iVar2 = maxLevel;
  }
  iVar1 = 1;
  if (iVar3 <= maxLevel) {
    iVar1 = (iVar2 - iVar3) + 1;
  }
  tcu::Texture3DView::Texture3DView
            (&local_18,iVar1,(ConstPixelBufferAccess *)((long)view + (long)iVar3 * 0x28));
  TVar4._4_4_ = 0;
  TVar4.m_numLevels = local_18.m_numLevels;
  TVar4.m_levels = local_18.m_levels;
  return TVar4;
}

Assistant:

static tcu::Texture3DView getSubView (const tcu::Texture3DView& view, int baseLevel, int maxLevel)
{
	const int	clampedBase	= de::clamp(baseLevel, 0, view.getNumLevels()-1);
	const int	clampedMax	= de::clamp(maxLevel, clampedBase, view.getNumLevels()-1);
	const int	numLevels	= clampedMax-clampedBase+1;
	return tcu::Texture3DView(numLevels, view.getLevels()+clampedBase);
}